

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O1

void __thiscall Minisat::Int64Option::printOptions(Int64Option *this,FILE *pcsFile,int granularity)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  char *__format;
  int64_t iVar4;
  ulong uVar5;
  long lVar6;
  vector<long,_std::allocator<long>_> values;
  char *pcVar7;
  vector<long,_std::allocator<long>_> local_48;
  
  pcVar3 = strstr((this->super_Option).name,"debug");
  if (((pcVar3 == (char *)0x0) &&
      (pcVar3 = strstr((this->super_Option).description,"debug"), pcVar3 == (char *)0x0)) &&
     (iVar2 = (*(this->super_Option)._vptr_Option[10])(this), (char)iVar2 != '\0')) {
    if (granularity == 0) {
      lVar6 = (this->range).begin;
      lVar1 = (this->range).end;
      if ((lVar1 == 0x7fffffff || (ulong)(lVar6 - lVar1) < 0xfffffffffffffff0) &&
         (lVar1 < 0 || 0 < lVar6)) {
        iVar4 = this->value;
        pcVar3 = (this->super_Option).name;
        pcVar7 = (this->super_Option).description;
        __format = "%s  [%ld,%ld] [%ld]il   # %s\n";
      }
      else {
        pcVar3 = (this->super_Option).name;
        if (0xffffffffffffffef < (ulong)(lVar6 - lVar1)) {
          fprintf((FILE *)pcsFile,"%s  {%ld",pcVar3);
          lVar6 = (this->range).begin;
          if (lVar6 < (this->range).end) {
            do {
              lVar6 = lVar6 + 1;
              fprintf((FILE *)pcsFile,",%ld",lVar6);
            } while (lVar6 < (this->range).end);
          }
          fprintf((FILE *)pcsFile,"} [%ld]    # %s\n",this->value,(this->super_Option).description);
          return;
        }
        pcVar7 = (this->super_Option).description;
        iVar4 = this->value;
        __format = "%s  [%ld,%ld] [%ld]i    # %s\n";
      }
      fprintf((FILE *)pcsFile,__format,pcVar3,lVar6,lVar1,iVar4,pcVar7);
    }
    else {
      fprintf((FILE *)pcsFile,"%s  {",(this->super_Option).name);
      local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      fillGranularityDomain(this,granularity,&local_48);
      if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        uVar5 = 0;
        do {
          if (uVar5 != 0) {
            fputc(0x2c,(FILE *)pcsFile);
          }
          fprintf((FILE *)pcsFile,"%ld",
                  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar5]);
          uVar5 = uVar5 + 1;
        } while (uVar5 < (ulong)((long)local_48.super__Vector_base<long,_std::allocator<long>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_48.super__Vector_base<long,_std::allocator<long>_>.
                                       _M_impl.super__Vector_impl_data._M_start >> 3));
      }
      fprintf((FILE *)pcsFile,"} [%ld]    # %s\n",this->value,(this->super_Option).description);
      if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void printOptions(FILE *pcsFile, int granularity)
    {

        if (strstr(name, "debug") != 0 || strstr(description, "debug") != 0) {
            return;
        } // do not print the parameter, if its related to debug output
        if (!wouldPrintOption()) {
            return;
        } // do not print option?

        // print only, if there is a default
        // choose between logarithmic scale and linear scale based on the number of elements in the list - more than 16 elements means it should be log (simple heuristic)

        if (granularity != 0) {
            fprintf(pcsFile, "%s  {", name);
            std::vector<int64_t> values;
            fillGranularityDomain(granularity, values);
            for (size_t i = 0; i < values.size(); ++i) {
                if (i != 0) {
                    fprintf(pcsFile, ",");
                }
                fprintf(pcsFile, "%ld", values[i]);
            }
            fprintf(pcsFile, "} [%ld]    # %s\n", value, description);
        } else {
            if ((range.end - range.begin <= 16 && range.end - range.begin > 0 && range.end != INT32_MAX) ||
                (range.begin <= 0 && range.end >= 0)) {
                if (range.end - range.begin <= 16 && range.end - range.begin > 0) { // print all values if the difference is really small
                    fprintf(pcsFile, "%s  {%ld", name, range.begin);
                    for (int64_t i = range.begin + 1; i <= range.end; ++i) {
                        fprintf(pcsFile, ",%ld", i);
                    }
                    fprintf(pcsFile, "} [%ld]    # %s\n", value, description);
                } else {
                    fprintf(pcsFile, "%s  [%ld,%ld] [%ld]i    # %s\n", name, range.begin, range.end, value, description);
                }
            } else {
                fprintf(pcsFile, "%s  [%ld,%ld] [%ld]il   # %s\n", name, range.begin, range.end, value, description);
            }
        }
    }